

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O0

int aom_get_qmlevel_allintra(int qindex,int first,int last)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int qm_level;
  undefined4 local_10;
  
  if (in_EDI < 0x29) {
    local_10 = 10;
  }
  else if (in_EDI < 0x65) {
    local_10 = 9;
  }
  else if (in_EDI < 0xa1) {
    local_10 = 8;
  }
  else if (in_EDI < 0xc9) {
    local_10 = 7;
  }
  else if (in_EDI < 0xdd) {
    local_10 = 6;
  }
  else if (in_EDI < 0xf1) {
    local_10 = 5;
  }
  else {
    local_10 = 4;
  }
  iVar1 = clamp(local_10,in_ESI,in_EDX);
  return iVar1;
}

Assistant:

static inline int aom_get_qmlevel_allintra(int qindex, int first, int last) {
  int qm_level = 0;

  if (qindex <= 40) {
    qm_level = 10;
  } else if (qindex <= 100) {
    qm_level = 9;
  } else if (qindex <= 160) {
    qm_level = 8;
  } else if (qindex <= 200) {
    qm_level = 7;
  } else if (qindex <= 220) {
    qm_level = 6;
  } else if (qindex <= 240) {
    qm_level = 5;
  } else {
    qm_level = 4;
  }

  return clamp(qm_level, first, last);
}